

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QSettingsKey,_QVariant>::erase
          (QMap<QSettingsKey,_QVariant> *this,const_iterator afirst,const_iterator alast)

{
  bool bVar1;
  map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  const_iterator unaff_retaddr;
  const_iterator in_stack_00000008;
  EraseResult result;
  iterator in_stack_ffffffffffffff88;
  QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
  *in_stack_ffffffffffffff98;
  map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>
  *this_00;
  const_iterator in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
                      *)0x7cb414);
  if (bVar1) {
    bVar1 = QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
            ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
                        *)in_RDI);
    if (bVar1) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
                    *)0x7cb4b2);
      QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
      ::erase((QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
               *)&DAT_aaaaaaaaaaaaaaaa,in_stack_00000008,unaff_retaddr);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
      ::reset((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
               *)this_00,in_stack_ffffffffffffff98);
      iterator::iterator((iterator *)0x7cb50a,in_stack_ffffffffffffff88);
    }
    else {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
                    *)0x7cb450);
      std::
      map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>
      ::erase(in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      iterator::iterator((iterator *)0x7cb48e,in_stack_ffffffffffffff88);
    }
  }
  else {
    memset(&local_10,0,8);
    iterator::iterator((iterator *)0x7cb433);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(const_iterator afirst, const_iterator alast)
    {
        if (!d)
            return iterator();

        if (!d.isShared())
            return iterator(d->m.erase(afirst.i, alast.i));

        auto result = d->erase(afirst.i, alast.i);
        d.reset(result.data);
        return iterator(result.it);
    }